

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O0

void __thiscall google::protobuf::internal::ShutdownData::~ShutdownData(ShutdownData *this)

{
  bool bVar1;
  iterator __first;
  iterator __last;
  reference ppVar2;
  pair<void_(*)(const_void_*),_const_void_*> pair;
  __normal_iterator<std::pair<void_(*)(const_void_*),_const_void_*>_*,_std::vector<std::pair<void_(*)(const_void_*),_const_void_*>,_std::allocator<std::pair<void_(*)(const_void_*),_const_void_*>_>_>_>
  local_40;
  iterator __end3;
  iterator __begin3;
  vector<std::pair<void_(*)(const_void_*),_const_void_*>,_std::allocator<std::pair<void_(*)(const_void_*),_const_void_*>_>_>
  *__range3;
  ShutdownData *this_local;
  
  __first = std::
            vector<std::pair<void_(*)(const_void_*),_const_void_*>,_std::allocator<std::pair<void_(*)(const_void_*),_const_void_*>_>_>
            ::begin(&this->functions);
  __last = std::
           vector<std::pair<void_(*)(const_void_*),_const_void_*>,_std::allocator<std::pair<void_(*)(const_void_*),_const_void_*>_>_>
           ::end(&this->functions);
  std::
  reverse<__gnu_cxx::__normal_iterator<std::pair<void(*)(void_const*),void_const*>*,std::vector<std::pair<void(*)(void_const*),void_const*>,std::allocator<std::pair<void(*)(void_const*),void_const*>>>>>
            ((__normal_iterator<std::pair<void_(*)(const_void_*),_const_void_*>_*,_std::vector<std::pair<void_(*)(const_void_*),_const_void_*>,_std::allocator<std::pair<void_(*)(const_void_*),_const_void_*>_>_>_>
              )__first._M_current,
             (__normal_iterator<std::pair<void_(*)(const_void_*),_const_void_*>_*,_std::vector<std::pair<void_(*)(const_void_*),_const_void_*>,_std::allocator<std::pair<void_(*)(const_void_*),_const_void_*>_>_>_>
              )__last._M_current);
  __end3 = std::
           vector<std::pair<void_(*)(const_void_*),_const_void_*>,_std::allocator<std::pair<void_(*)(const_void_*),_const_void_*>_>_>
           ::begin(&this->functions);
  local_40._M_current =
       (pair<void_(*)(const_void_*),_const_void_*> *)
       std::
       vector<std::pair<void_(*)(const_void_*),_const_void_*>,_std::allocator<std::pair<void_(*)(const_void_*),_const_void_*>_>_>
       ::end(&this->functions);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end3,&local_40);
    if (!bVar1) break;
    ppVar2 = __gnu_cxx::
             __normal_iterator<std::pair<void_(*)(const_void_*),_const_void_*>_*,_std::vector<std::pair<void_(*)(const_void_*),_const_void_*>,_std::allocator<std::pair<void_(*)(const_void_*),_const_void_*>_>_>_>
             ::operator*(&__end3);
    (*ppVar2->first)(ppVar2->second);
    __gnu_cxx::
    __normal_iterator<std::pair<void_(*)(const_void_*),_const_void_*>_*,_std::vector<std::pair<void_(*)(const_void_*),_const_void_*>,_std::allocator<std::pair<void_(*)(const_void_*),_const_void_*>_>_>_>
    ::operator++(&__end3);
  }
  absl::lts_20240722::Mutex::Dtor();
  std::
  vector<std::pair<void_(*)(const_void_*),_const_void_*>,_std::allocator<std::pair<void_(*)(const_void_*),_const_void_*>_>_>
  ::~vector(&this->functions);
  return;
}

Assistant:

~ShutdownData() {
    std::reverse(functions.begin(), functions.end());
    for (auto pair : functions) pair.first(pair.second);
  }